

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,_ft::allocator<int>_>::insert
          (list<int,_ft::allocator<int>_> *this,iterator *position,size_type n,
          value_type_conflict *val)

{
  bool bVar1;
  undefined1 local_50 [32];
  
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_50._16_8_ = &PTR__listIterator_0010dd60;
    local_50._24_8_ = position->m_node;
    insert((list<int,_ft::allocator<int>_> *)local_50,(iterator *)this,
           (value_type_conflict *)(local_50 + 0x10));
  }
  return;
}

Assistant:

void 		insert(iterator position, size_type n, value_type const & val) {
		for (size_type i = 0; i < n; ++i)
			this->insert(position, val);
	}